

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_str.c
# Opt level: O3

char * sr_stat_str(SRunner *sr)

{
  uint uVar1;
  uint uVar2;
  TestStats *pTVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pTVar3 = sr->stats;
  uVar1 = pTVar3->n_failed;
  if ((uVar1 == 0) && (pTVar3->n_errors == 0)) {
    uVar5 = (ulong)(uint)pTVar3->n_checked;
    uVar6 = 100;
    uVar7 = 0;
  }
  else {
    uVar2 = pTVar3->n_checked;
    uVar5 = (ulong)uVar2;
    uVar7 = (ulong)(uint)pTVar3->n_errors;
    if (uVar2 == 0) {
      uVar5 = 0;
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)(uint)(int)(((float)(int)((uVar2 - uVar1) - pTVar3->n_errors) /
                                 (float)(int)uVar2) * 100.0);
    }
  }
  pcVar4 = ck_strdup_printf("%d%%: Checks: %d, Failures: %d, Errors: %d",uVar6,uVar5,(ulong)uVar1,
                            uVar7);
  return pcVar4;
}

Assistant:

char *sr_stat_str(SRunner * sr)
{
    char *str;
    TestStats *ts;

    ts = sr->stats;

    str = ck_strdup_printf("%d%%: Checks: %d, Failures: %d, Errors: %d",
                           percent_passed(ts), ts->n_checked, ts->n_failed,
                           ts->n_errors);

    return str;
}